

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::readLongToBcd(DecimalQuantity *this,int64_t n)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (n < 10000000000000000) {
    bVar1 = 0;
    uVar2 = 0;
    uVar3 = 0;
    for (; n != 0; n = n / 10) {
      uVar3 = uVar3 >> 4 | n % 10 << 0x3c;
      bVar1 = bVar1 - 4;
      uVar2 = (ulong)((int)uVar2 + 1);
    }
    (this->fBCD).bcdLong = uVar3 >> (bVar1 & 0x3f);
  }
  else {
    ensureCapacity(this);
    uVar2 = 0;
    for (; n != 0; n = n / 10) {
      (this->fBCD).bcdBytes.ptr[uVar2] = (int8_t)(n % 10);
      uVar2 = uVar2 + 1;
    }
  }
  this->scale = 0;
  this->precision = (int32_t)uVar2;
  return;
}

Assistant:

void DecimalQuantity::readLongToBcd(int64_t n) {
    U_ASSERT(n != 0);
    if (n >= 10000000000000000L) {
        ensureCapacity();
        int i = 0;
        for (; n != 0L; n /= 10L, i++) {
            fBCD.bcdBytes.ptr[i] = static_cast<int8_t>(n % 10);
        }
        U_ASSERT(usingBytes);
        scale = 0;
        precision = i;
    } else {
        uint64_t result = 0L;
        int i = 16;
        for (; n != 0L; n /= 10L, i--) {
            result = (result >> 4) + ((n % 10) << 60);
        }
        U_ASSERT(i >= 0);
        U_ASSERT(!usingBytes);
        fBCD.bcdLong = result >> (i * 4);
        scale = 0;
        precision = 16 - i;
    }
}